

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mouse.cpp
# Opt level: O0

void __thiscall Mouse::TrimBuffer(Mouse *this)

{
  size_type sVar1;
  Mouse *this_local;
  
  while( true ) {
    sVar1 = std::queue<Mouse::Event,_std::deque<Mouse::Event,_std::allocator<Mouse::Event>_>_>::size
                      (&this->buffer);
    if (sVar1 < 5) break;
    std::queue<Mouse::Event,_std::deque<Mouse::Event,_std::allocator<Mouse::Event>_>_>::pop
              (&this->buffer);
  }
  return;
}

Assistant:

void Mouse::TrimBuffer()
{
	while( buffer.size() > bufferSize )
	{
		buffer.pop();
	}
}